

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::TrustTokenMetadataTest_TooManyRequests_Test::TestBody
          (TrustTokenMetadataTest_TooManyRequests_Test *this)

{
  uint32_t public_metadata;
  TRUST_TOKEN_ISSUER *ctx;
  HasNewFatalFailureHelper *pHVar1;
  uint8_t *request;
  bool bVar2;
  int iVar3;
  ParamType *pPVar4;
  pointer *__ptr_4;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __ptr_00;
  char *in_R9;
  char *pcVar5;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  UniquePtr<uint8_t> free_issue_msg;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  size_t tokens_issued;
  size_t key_index;
  UniquePtr<uint8_t> free_msg;
  AssertHelper local_60;
  UniquePtr<struct_stack_st_TRUST_TOKEN> tokens;
  uint8_t *issue_resp;
  uint8_t *issue_msg;
  size_t msg_len;
  size_t resp_len;
  
  if ((((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.method_)->
       has_private_metadata == 0) &&
     (pPVar4 = testing::
               WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>::
               GetParam(),
     (pPVar4->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>).
     super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
     super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl != false)) {
    return;
  }
  (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.issuer_max_batchsize = 1;
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) {
LAB_0039f350:
    testing::Message::Message((Message *)&gtest_fatal_failure_checker);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x3fa,
               "Expected: SetupContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_,(Message *)&gtest_fatal_failure_checker);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                         _vptr_TestPartResultReporterInterface._1_7_,
                         (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.
                                     super_TestPartResultReporterInterface.
                                     _vptr_TestPartResultReporterInterface._1_7_,
                                     (char)gtest_fatal_failure_checker.
                                           super_TestPartResultReporterInterface.
                                           _vptr_TestPartResultReporterInterface) + 8))();
    }
    return;
  }
  testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
            (&gtest_fatal_failure_checker);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TrustTokenProtocolTestBase::SetupContexts((TrustTokenProtocolTestBase *)this);
  }
  bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
  testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
            (&gtest_fatal_failure_checker);
  if (bVar2 == true) goto LAB_0039f350;
  issue_msg = (uint8_t *)0x0;
  issue_resp = (uint8_t *)0x0;
  if ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.use_msg_ == true) {
    pcVar5 = &DAT_00000004;
    iVar3 = TRUST_TOKEN_CLIENT_begin_issuance_over_message
                      ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                       _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,
                       &issue_msg,&msg_len,10,"MSG",4);
    bVar2 = iVar3 != 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = bVar2;
    if (!bVar2) {
      testing::Message::Message((Message *)&free_issue_msg);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance_over_message( client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage))"
                 ,"false","true",pcVar5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tokens_issued,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x400,(char *)CONCAT71(gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface._1_7_,
                                         (char)gtest_fatal_failure_checker.
                                               super_TestPartResultReporterInterface.
                                               _vptr_TestPartResultReporterInterface));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&tokens_issued,(Message *)&free_issue_msg);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tokens_issued);
      if ((TestPartResultReporterInterface **)
          CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                   _vptr_TestPartResultReporterInterface._1_7_,
                   (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                         _vptr_TestPartResultReporterInterface) !=
          &gtest_fatal_failure_checker.original_reporter_) {
        operator_delete((undefined1 *)
                        CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                                 _vptr_TestPartResultReporterInterface._1_7_,
                                 (char)gtest_fatal_failure_checker.
                                       super_TestPartResultReporterInterface.
                                       _vptr_TestPartResultReporterInterface),
                        (ulong)((long)&(gtest_fatal_failure_checker.original_reporter_)->
                                       _vptr_TestPartResultReporterInterface + 1));
      }
      if ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)
          free_issue_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)free_issue_msg._M_t.
                              super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8))();
      }
joined_r0x0039f77b:
      if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        return;
      }
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_.message_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
      return;
    }
  }
  else {
    iVar3 = TRUST_TOKEN_CLIENT_begin_issuance
                      ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                       _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>
                       .super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,
                       &issue_msg,&msg_len,10);
    bVar2 = iVar3 != 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = bVar2;
    if (!bVar2) {
      testing::Message::Message((Message *)&free_issue_msg);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg, &msg_len, 10)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tokens_issued,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x403,(char *)CONCAT71(gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface._1_7_,
                                         (char)gtest_fatal_failure_checker.
                                               super_TestPartResultReporterInterface.
                                               _vptr_TestPartResultReporterInterface));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&tokens_issued,(Message *)&free_issue_msg);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tokens_issued);
      if ((TestPartResultReporterInterface **)
          CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                   _vptr_TestPartResultReporterInterface._1_7_,
                   (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                         _vptr_TestPartResultReporterInterface) !=
          &gtest_fatal_failure_checker.original_reporter_) {
        operator_delete((undefined1 *)
                        CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                                 _vptr_TestPartResultReporterInterface._1_7_,
                                 (char)gtest_fatal_failure_checker.
                                       super_TestPartResultReporterInterface.
                                       _vptr_TestPartResultReporterInterface),
                        (ulong)((long)&(gtest_fatal_failure_checker.original_reporter_)->
                                       _vptr_TestPartResultReporterInterface + 1));
      }
      if ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)
          free_issue_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)free_issue_msg._M_t.
                              super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8))();
      }
      goto joined_r0x0039f77b;
    }
  }
  request = issue_msg;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  free_issue_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)issue_msg;
  ctx = (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.issuer._M_t.
        super___uniq_ptr_impl<trust_token_issuer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_trust_token_issuer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_trust_token_issuer_st_*,_false>._M_head_impl;
  pPVar4 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>
           ::GetParam();
  public_metadata =
       (pPVar4->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>).
       super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
       super__Head_base<2UL,_int,_false>._M_head_impl;
  pPVar4 = testing::WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>
           ::GetParam();
  iVar3 = TRUST_TOKEN_ISSUER_issue
                    (ctx,&issue_resp,&resp_len,&tokens_issued,request,msg_len,public_metadata,
                     (pPVar4->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_int,_bool>
                     ).super__Tuple_impl<1UL,_bool,_int,_bool>.super__Tuple_impl<2UL,_int,_bool>.
                     super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl,1)
  ;
  gtest_ar_.success_ = iVar3 != 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)&free_msg);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
               (AssertionResult *)
               "TRUST_TOKEN_ISSUER_issue( issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len, public_metadata(), private_metadata(), 1)"
               ,"false","true",(char *)msg_len);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key_index,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x409,(char *)CONCAT71(gtest_fatal_failure_checker.
                                       super_TestPartResultReporterInterface.
                                       _vptr_TestPartResultReporterInterface._1_7_,
                                       (char)gtest_fatal_failure_checker.
                                             super_TestPartResultReporterInterface.
                                             _vptr_TestPartResultReporterInterface));
    testing::internal::AssertHelper::operator=((AssertHelper *)&key_index,(Message *)&free_msg);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key_index);
    if ((TestPartResultReporterInterface **)
        CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                 _vptr_TestPartResultReporterInterface._1_7_,
                 (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface) !=
        &gtest_fatal_failure_checker.original_reporter_) {
      operator_delete((undefined1 *)
                      CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._1_7_,
                               (char)gtest_fatal_failure_checker.
                                     super_TestPartResultReporterInterface.
                                     _vptr_TestPartResultReporterInterface),
                      (ulong)((long)&(gtest_fatal_failure_checker.original_reporter_)->
                                     _vptr_TestPartResultReporterInterface + 1));
    }
    if ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)
        free_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)free_msg._M_t.
                            super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 8))();
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_.message_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    goto LAB_0039f907;
  }
  free_msg._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)issue_resp;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_short>
            ((internal *)&gtest_fatal_failure_checker,"tokens_issued","issuer_max_batchsize",
             &tokens_issued,
             &(this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.
              issuer_max_batchsize);
  if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
            _vptr_TestPartResultReporterInterface == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((undefined8 *)
        CONCAT71(gtest_fatal_failure_checker._9_7_,
                 gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(gtest_fatal_failure_checker._9_7_,
                                  gtest_fatal_failure_checker.has_new_fatal_failure_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key_index,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x40b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key_index,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key_index);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(gtest_fatal_failure_checker._9_7_,
                 gtest_fatal_failure_checker.has_new_fatal_failure_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_fatal_failure_checker.has_new_fatal_failure_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_));
    }
  }
  else {
    pcVar5 = (char *)msg_len;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(gtest_fatal_failure_checker._9_7_,
                 gtest_fatal_failure_checker.has_new_fatal_failure_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_fatal_failure_checker.has_new_fatal_failure_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_));
      pcVar5 = (char *)msg_len;
    }
    tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_TRUST_TOKEN,_bssl::internal::Deleter,_true,_true>)
         TRUST_TOKEN_CLIENT_finish_issuance
                   ((this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.client.
                    _M_t.super___uniq_ptr_impl<trust_token_client_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_trust_token_client_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_trust_token_client_st_*,_false>._M_head_impl,&key_index,
                    issue_resp,resp_len);
    gtest_ar_.success_ =
         (tuple<stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>)
         tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl !=
         (_Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>)0x0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if ((tuple<stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>)
        tokens._M_t.super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl ==
        (_Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>)0x0) {
      pHVar1 = (HasNewFatalFailureHelper *)&gtest_ar_;
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_fatal_failure_checker,(internal *)&gtest_ar_,
                 (AssertionResult *)"tokens","false","true",pcVar5);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x410,(char *)CONCAT71(gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface._1_7_,
                                         (char)gtest_fatal_failure_checker.
                                               super_TestPartResultReporterInterface.
                                               _vptr_TestPartResultReporterInterface));
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if ((TestPartResultReporterInterface **)
          CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                   _vptr_TestPartResultReporterInterface._1_7_,
                   (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                         _vptr_TestPartResultReporterInterface) !=
          &gtest_fatal_failure_checker.original_reporter_) {
        operator_delete((undefined1 *)
                        CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                                 _vptr_TestPartResultReporterInterface._1_7_,
                                 (char)gtest_fatal_failure_checker.
                                       super_TestPartResultReporterInterface.
                                       _vptr_TestPartResultReporterInterface),
                        (ulong)((long)&(gtest_fatal_failure_checker.original_reporter_)->
                                       _vptr_TestPartResultReporterInterface + 1));
      }
      if (local_80._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
      __ptr_00._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) goto LAB_0039f8ee;
    }
    else {
      gtest_ar_._0_8_ =
           OPENSSL_sk_num((OPENSSL_STACK *)
                          tokens._M_t.
                          super___uniq_ptr_impl<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_stack_st_TRUST_TOKEN_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_stack_st_TRUST_TOKEN_*,_false>._M_head_impl);
      local_80._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_fatal_failure_checker,"sk_TRUST_TOKEN_num(tokens.get())","1UL",
                 (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_80);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)CONCAT71(gtest_fatal_failure_checker._9_7_,
                                      gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                   ,0x411,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      __ptr_00._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._1_7_ = gtest_fatal_failure_checker._9_7_;
      __ptr_00._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = gtest_fatal_failure_checker.has_new_fatal_failure_;
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )__ptr_00._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pHVar1 = &gtest_fatal_failure_checker;
LAB_0039f8ee:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pHVar1->has_new_fatal_failure_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
      }
    }
    std::unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>::~unique_ptr(&tokens);
  }
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_msg);
LAB_0039f907:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_issue_msg);
  return;
}

Assistant:

TEST_P(TrustTokenMetadataTest, TooManyRequests) {
  if (!method()->has_private_metadata && private_metadata()) {
    return;
  }

  issuer_max_batchsize = 1;
  ASSERT_NO_FATAL_FAILURE(SetupContexts());

  uint8_t *issue_msg = NULL, *issue_resp = NULL;
  size_t msg_len, resp_len;
  if (use_message()) {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance_over_message(
        client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage)));
  } else {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg,
                                                  &msg_len, 10));
  }
  bssl::UniquePtr<uint8_t> free_issue_msg(issue_msg);
  size_t tokens_issued;
  ASSERT_TRUE(TRUST_TOKEN_ISSUER_issue(
      issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len,
      public_metadata(), private_metadata(), /*max_issuance=*/1));
  bssl::UniquePtr<uint8_t> free_msg(issue_resp);
  ASSERT_EQ(tokens_issued, issuer_max_batchsize);
  size_t key_index;
  bssl::UniquePtr<STACK_OF(TRUST_TOKEN)> tokens(
      TRUST_TOKEN_CLIENT_finish_issuance(client.get(), &key_index, issue_resp,
                                         resp_len));
  ASSERT_TRUE(tokens);
  ASSERT_EQ(sk_TRUST_TOKEN_num(tokens.get()), 1UL);
}